

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

cio_error cio_socket_close(cio_socket *socket)

{
  cio_socket *socket_local;
  
  if (socket == (cio_socket *)0x0) {
    socket_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else if (((socket->impl).peer_closed_connection & 1U) == 0) {
    if ((socket->impl).close_timeout_ns == 0) {
      close_socket(socket);
      socket_local._4_4_ = CIO_SUCCESS;
    }
    else {
      shutdown_socket(socket,(socket->impl).close_timeout_ns);
      socket_local._4_4_ = CIO_SUCCESS;
    }
  }
  else {
    close_socket(socket);
    socket_local._4_4_ = CIO_SUCCESS;
  }
  return socket_local._4_4_;
}

Assistant:

enum cio_error cio_socket_close(struct cio_socket *socket)
{
	if (cio_unlikely(socket == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	if (socket->impl.peer_closed_connection) {
		close_socket(socket);
		return CIO_SUCCESS;
	}

	if (socket->impl.close_timeout_ns > 0) {
		shutdown_socket(socket, socket->impl.close_timeout_ns);
		return CIO_SUCCESS;
	}

	close_socket(socket);
	return CIO_SUCCESS;
}